

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cmp.cpp
# Opt level: O0

bool __thiscall CmdCmp::Execute(CmdCmp *this)

{
  byte bVar1;
  FileType FVar2;
  size_type sVar3;
  ostream *poVar4;
  reference pvVar5;
  reference pbVar6;
  char *pcVar7;
  byte local_542;
  int local_49c;
  int local_498;
  int cntByte;
  int cntLine;
  char t2;
  char t1;
  ifstream file2;
  char local_288 [8];
  ifstream file1;
  string local_60 [8];
  string fileName2;
  string local_40 [8];
  string fileName1;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  iterator i;
  CmdCmp *this_local;
  
  i._M_node = (_List_node_base *)this;
  sVar3 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&(this->super_Command).option);
  if (sVar3 == 0) {
    sVar3 = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->super_Command).parameter);
    if (sVar3 < 2) {
      poVar4 = std::operator<<((ostream *)&std::cout,"error");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
    else {
      local_20._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&(this->super_Command).parameter);
      std::__cxx11::string::string(local_40);
      std::__cxx11::string::string(local_60);
      pbVar6 = std::
               _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20);
      std::__cxx11::string::operator=(local_40,(string *)pbVar6);
      std::
      _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_20,0);
      pbVar6 = std::
               _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20);
      std::__cxx11::string::operator=(local_60,(string *)pbVar6);
      FVar2 = DirUtils::GetFileType((string *)local_40);
      if (FVar2 == DU_DIRECTORY) {
        poVar4 = std::operator<<((ostream *)&std::cout,"cmp: ");
        poVar4 = std::operator<<(poVar4,local_40);
        poVar4 = std::operator<<(poVar4,": Is a directory");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = false;
      }
      else {
        FVar2 = DirUtils::GetFileType((string *)local_60);
        if (FVar2 == DU_DIRECTORY) {
          poVar4 = std::operator<<((ostream *)&std::cout,"cmp: ");
          poVar4 = std::operator<<(poVar4,local_60);
          poVar4 = std::operator<<(poVar4,": Is a directory");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          this_local._7_1_ = false;
        }
        else {
          pcVar7 = (char *)std::__cxx11::string::c_str();
          std::ifstream::ifstream(local_288,pcVar7,_S_bin);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          std::ifstream::ifstream(&cntLine,pcVar7,_S_bin);
          bVar1 = std::ifstream::is_open();
          if ((bVar1 & 1) == 0) {
            poVar4 = std::operator<<((ostream *)&std::cout,"cmp: ");
            poVar4 = std::operator<<(poVar4,local_40);
            poVar4 = std::operator<<(poVar4,": No such file or directory");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            this_local._7_1_ = false;
          }
          else {
            bVar1 = std::ifstream::is_open();
            if ((bVar1 & 1) == 0) {
              poVar4 = std::operator<<((ostream *)&std::cout,"cmp: ");
              poVar4 = std::operator<<(poVar4,local_60);
              poVar4 = std::operator<<(poVar4,": No such file or directory");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              this_local._7_1_ = false;
            }
            else {
              local_498 = 1;
              local_49c = 0;
              while( true ) {
                bVar1 = std::ios::eof();
                local_542 = 0;
                if ((bVar1 & 1) == 0) {
                  local_542 = std::ios::eof();
                  local_542 = local_542 ^ 0xff;
                }
                if ((local_542 & 1) == 0) {
                  this_local._7_1_ = true;
                  goto LAB_001182df;
                }
                local_49c = local_49c + 1;
                std::istream::read(local_288,(long)&cntByte + 3);
                std::istream::read((char *)&cntLine,(long)&cntByte + 2);
                bVar1 = std::ios::fail();
                if (((bVar1 & 1) != 0) && (bVar1 = std::ios::fail(), (bVar1 & 1) != 0)) {
                  this_local._7_1_ = true;
                  goto LAB_001182df;
                }
                bVar1 = std::ios::fail();
                if ((bVar1 & 1) != 0) {
                  poVar4 = std::operator<<((ostream *)&std::cout,"cmp: EOF on ");
                  poVar4 = std::operator<<(poVar4,local_40);
                  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                  this_local._7_1_ = false;
                  goto LAB_001182df;
                }
                bVar1 = std::ios::fail();
                if ((bVar1 & 1) != 0) {
                  poVar4 = std::operator<<((ostream *)&std::cout,"cmp: EOF on ");
                  poVar4 = std::operator<<(poVar4,local_60);
                  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                  this_local._7_1_ = false;
                  goto LAB_001182df;
                }
                if (cntByte._3_1_ != cntByte._2_1_) break;
                if (cntByte._3_1_ == '\n') {
                  local_498 = local_498 + 1;
                }
              }
              poVar4 = std::operator<<((ostream *)&std::cout,local_40);
              poVar4 = std::operator<<(poVar4,' ');
              poVar4 = std::operator<<(poVar4,local_60);
              std::operator<<(poVar4," differ: ");
              poVar4 = std::operator<<((ostream *)&std::cout,"byte ");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_49c);
              std::operator<<(poVar4,", ");
              poVar4 = std::operator<<((ostream *)&std::cout,"line ");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_498);
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              this_local._7_1_ = false;
            }
          }
LAB_001182df:
          std::ifstream::~ifstream(&cntLine);
          std::ifstream::~ifstream(local_288);
        }
      }
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_40);
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"cmp: invalid option -- \'");
    pvVar5 = std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front(&(this->super_Command).option);
    poVar4 = std::operator<<(poVar4,(string *)pvVar5);
    poVar4 = std::operator<<(poVar4,"\'");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"Try \'cmp -- help\' for more information.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CmdCmp::Execute(){
	if(option.size() != 0){	
		cout << "cmp: invalid option -- '" << option.front() << "'" << endl;
		cout << "Try 'cmp -- help' for more information." << endl;
		return false;
	}
	if(parameter.size() < 2){
		cout << "error" << endl;
		return false;
	}
	auto i = parameter.begin();
	string fileName1, fileName2;
	fileName1 = (*i);
	i++;
	fileName2 = (*i);

	if(GetFileType(fileName1) == DU_DIRECTORY){
		cout << "cmp: " << fileName1 << ": Is a directory" << endl;
		return false;
	}
	if(GetFileType(fileName2) == DU_DIRECTORY){
		cout << "cmp: " << fileName2 << ": Is a directory" << endl;
		return false;
	}
	/* input file */
	ifstream file1(fileName1.c_str(), ios::binary),
		file2(fileName2.c_str(), ios::binary);
	if(!file1.is_open()){
		cout << "cmp: " << fileName1 << ": No such file or directory" << endl;
		return false;
	}
	if(!file2.is_open()){
		cout << "cmp: " << fileName2 << ": No such file or directory" << endl;
		return false;
	}
	/* comparing */
	char t1, t2;
	int cntLine = 1, cntByte = 0;

	while(!file1.eof() && !file2.eof()){
		cntByte++;
		file1.read(&t1, sizeof(t1));
		file2.read(&t2, sizeof(t2));
		if(file1.fail() && file2.fail())return true;
		if(file1.fail()){
			cout << "cmp: EOF on " << fileName1 << endl;
			return false;
		}
		if(file2.fail()){
			cout << "cmp: EOF on " << fileName2 << endl;
			return false;
		}
		if(t1 != t2){
			cout << fileName1 << ' ' << fileName2 << " differ: ";
			cout << "byte " << cntByte << ", ";
			cout << "line " << cntLine << endl;
			return 0;
		}
		if(t1 == '\n')cntLine++;
	}

	return true;
}